

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.h
# Opt level: O0

uint32_t mp_decode_binl(char **data)

{
  uint8_t uVar1;
  byte bVar2;
  uint16_t uVar3;
  uint8_t c;
  char **data_local;
  
  uVar1 = mp_load_u8(data);
  if (uVar1 == 0xc4) {
    bVar2 = mp_load_u8(data);
    data_local._4_4_ = (uint32_t)bVar2;
  }
  else if (uVar1 == 0xc5) {
    uVar3 = mp_load_u16(data);
    data_local._4_4_ = (uint32_t)uVar3;
  }
  else {
    if (uVar1 != 0xc6) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/msgpuck.h"
                    ,0xa71,"uint32_t mp_decode_binl(const char **)");
    }
    data_local._4_4_ = mp_load_u32(data);
  }
  return data_local._4_4_;
}

Assistant:

MP_IMPL uint32_t
mp_decode_binl(const char **data)
{
	uint8_t c = mp_load_u8(data);

	switch (c) {
	case 0xc4:
		return mp_load_u8(data);
	case 0xc5:
		return mp_load_u16(data);
	case 0xc6:
		return mp_load_u32(data);
	default:
		mp_unreachable();
	}
}